

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

void slot_ops_with_log(MppBufSlotsImpl *impl,MppBufSlotEntry *slot,MppBufSlotOps op,void *arg)

{
  uint index_00;
  SlotStatus before_00;
  bool bVar1;
  SlotStatus local_3c;
  SlotStatus before;
  SlotStatus status;
  RK_S32 index;
  RK_U32 error;
  void *arg_local;
  MppBufSlotOps op_local;
  MppBufSlotEntry *slot_local;
  MppBufSlotsImpl *impl_local;
  
  bVar1 = false;
  index_00 = slot->index;
  before_00 = (SlotStatus)(slot->status).val;
  local_3c = before_00;
  switch(op) {
  case SLOT_INIT:
    local_3c.val = 0;
    break;
  case SLOT_SET_ON_USE:
    local_3c.val = before_00.val & 0xfffffffe | 1;
    break;
  case SLOT_CLR_ON_USE:
    local_3c.val = before_00.val & 0xfffffffe;
    break;
  case SLOT_SET_NOT_READY:
    local_3c.val = before_00.val & 0xfffffffd | 2;
    break;
  case SLOT_CLR_NOT_READY:
    local_3c.val = before_00.val & 0xfffffffd;
    break;
  case SLOT_SET_CODEC_READY:
    local_3c.val = before_00.val & 0xfffffffd;
    break;
  case SLOT_CLR_CODEC_READY:
    local_3c.val = before_00.val & 0xfffffffd | 2;
    break;
  case SLOT_SET_CODEC_USE:
    local_3c.val = before_00.val & 0xfffffffb | 4;
    break;
  case SLOT_CLR_CODEC_USE:
    local_3c.val = before_00.val & 0xfffffffb;
    break;
  case SLOT_SET_HAL_INPUT:
    local_3c.val = before_00.val & 0xffffe01f | ((before_00.val >> 5 & 0xff) + 1 & 0xff) << 5;
    break;
  case SLOT_CLR_HAL_INPUT:
    bVar1 = (before_00.val >> 5 & 0xff) == 0;
    if (bVar1) {
      _mpp_log_l(2,"mpp_buf_slot","can not clr hal_input on slot %d\n",(char *)0x0,
                 (ulong)(uint)slot->index);
    }
    else {
      local_3c.val = before_00.val & 0xffffe01f | ((before_00.val >> 5 & 0xff) - 1 & 0xff) << 5;
    }
    break;
  case SLOT_SET_HAL_OUTPUT:
    local_3c.val = before_00.val & 0xffffffe5 | ((before_00.val >> 3 & 3) + 1 & 3) << 3 | 2;
    break;
  case SLOT_CLR_HAL_OUTPUT:
    if ((before_00.val >> 3 & 3) == 0) {
      _mpp_log_l(2,"mpp_buf_slot","can not clr hal_output on slot %d\n",(char *)0x0,
                 (ulong)(uint)slot->index);
    }
    else {
      local_3c.val = before_00.val & 0xffffffe7 | ((before_00.val >> 3 & 3) - 1 & 3) << 3;
    }
    if ((local_3c.val >> 3 & 3) == 0) {
      local_3c.val = local_3c.val & 0xfffffffd;
    }
    break;
  case SLOT_SET_QUEUE_USE:
  case SLOT_ENQUEUE:
  case SLOT_ENQUEUE_DISPLAY:
  case SLOT_ENQUEUE_DEINTER:
  case SLOT_ENQUEUE_CONVERT:
    local_3c.val = before_00.val & 0xfffc1fff | ((before_00.val >> 0xd & 0x1f) + 1 & 0x1f) << 0xd;
    break;
  case SLOT_CLR_QUEUE_USE:
  case SLOT_DEQUEUE:
  case SLOT_DEQUEUE_DISPLAY:
  case SLOT_DEQUEUE_DEINTER:
  case SLOT_DEQUEUE_CONVERT:
    bVar1 = (before_00.val >> 0xd & 0x1f) == 0;
    if (bVar1) {
      _mpp_log_l(2,"mpp_buf_slot","can not clr queue_use on slot %d\n",(char *)0x0,
                 (ulong)(uint)slot->index);
    }
    else {
      local_3c.val = before_00.val & 0xfffc1fff | ((before_00.val >> 0xd & 0x1f) - 1 & 0x1f) << 0xd;
    }
    break;
  case SLOT_SET_EOS:
    local_3c.val = before_00.val & 0xfffbffff | 0x40000;
    break;
  case SLOT_CLR_EOS:
    slot->eos = 0;
    local_3c.val = before_00.val & 0xfffbffff;
    break;
  case SLOT_SET_FRAME:
    local_3c.val = before_00.val & 0xffefffff | (uint)(arg != (void *)0x0) << 0x14;
    break;
  case SLOT_CLR_FRAME:
    local_3c.val = before_00.val & 0xffefffff;
    break;
  case SLOT_SET_BUFFER:
    local_3c.val = before_00.val & 0xfff7ffff | (uint)(arg != (void *)0x0) << 0x13;
    break;
  case SLOT_CLR_BUFFER:
    local_3c.val = before_00.val & 0xfff7ffff;
    break;
  default:
    _mpp_log_l(2,"mpp_buf_slot","found invalid operation code %d\n",(char *)0x0,(ulong)op);
    bVar1 = true;
  }
  (slot->status).val = (RK_U32)local_3c;
  if ((buf_slot_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_buf_slot","slot %3d index %2d op: %s arg %010p status in %08x out %08x",
               (char *)0x0,(ulong)impl->slots_idx,(ulong)index_00,op_string + op,arg,before_00.val,
               local_3c.val);
  }
  if (impl->logs != (MppBufSlotLogs *)0x0) {
    buf_slot_logs_write(impl->logs,index_00,op,before_00,local_3c);
  }
  if (bVar1) {
    _dump_slots("slot_ops_with_log",impl);
  }
  return;
}

Assistant:

static void slot_ops_with_log(MppBufSlotsImpl *impl, MppBufSlotEntry *slot, MppBufSlotOps op, void *arg)
{
    RK_U32 error = 0;
    RK_S32 index = slot->index;
    SlotStatus status = slot->status;
    SlotStatus before = status;
    switch (op) {
    case SLOT_INIT : {
        status.val = 0;
    } break;
    case SLOT_SET_ON_USE : {
        status.on_used = 1;
    } break;
    case SLOT_CLR_ON_USE : {
        status.on_used = 0;
    } break;
    case SLOT_SET_NOT_READY : {
        status.not_ready = 1;
    } break;
    case SLOT_CLR_NOT_READY : {
        status.not_ready = 0;
    } break;
    case SLOT_SET_CODEC_READY : {
        status.not_ready = 0;
    } break;
    case SLOT_CLR_CODEC_READY : {
        status.not_ready = 1;
    } break;
    case SLOT_SET_CODEC_USE : {
        status.codec_use = 1;
    } break;
    case SLOT_CLR_CODEC_USE : {
        status.codec_use = 0;
    } break;
    case SLOT_SET_HAL_INPUT : {
        status.hal_use++;
    } break;
    case SLOT_CLR_HAL_INPUT : {
        if (status.hal_use)
            status.hal_use--;
        else {
            mpp_err("can not clr hal_input on slot %d\n", slot->index);
            error = 1;
        }
    } break;
    case SLOT_SET_HAL_OUTPUT : {
        status.hal_output++;
        status.not_ready  = 1;
    } break;
    case SLOT_CLR_HAL_OUTPUT : {
        if (status.hal_output)
            status.hal_output--;
        else
            mpp_err("can not clr hal_output on slot %d\n", slot->index);

        // NOTE: set output index ready here
        if (!status.hal_output)
            status.not_ready  = 0;
    } break;
    case SLOT_SET_QUEUE_USE :
    case SLOT_ENQUEUE_OUTPUT :
    case SLOT_ENQUEUE_DISPLAY :
    case SLOT_ENQUEUE_DEINTER :
    case SLOT_ENQUEUE_CONVERT : {
        status.queue_use++;
    } break;
    case SLOT_CLR_QUEUE_USE :
    case SLOT_DEQUEUE_OUTPUT :
    case SLOT_DEQUEUE_DISPLAY :
    case SLOT_DEQUEUE_DEINTER :
    case SLOT_DEQUEUE_CONVERT : {
        if (status.queue_use)
            status.queue_use--;
        else {
            mpp_err("can not clr queue_use on slot %d\n", slot->index);
            error = 1;
        }
    } break;
    case SLOT_SET_EOS : {
        status.eos = 1;
    } break;
    case SLOT_CLR_EOS : {
        status.eos = 0;
        slot->eos = 0;
    } break;
    case SLOT_SET_FRAME : {
        status.has_frame = (arg) ? (1) : (0);
    } break;
    case SLOT_CLR_FRAME : {
        status.has_frame = 0;
    } break;
    case SLOT_SET_BUFFER : {
        status.has_buffer = (arg) ? (1) : (0);
    } break;
    case SLOT_CLR_BUFFER : {
        status.has_buffer = 0;
    } break;
    default : {
        mpp_err("found invalid operation code %d\n", op);
        error = 1;
    } break;
    }
    slot->status = status;
    buf_slot_dbg(BUF_SLOT_DBG_OPS_RUNTIME, "slot %3d index %2d op: %s arg %010p status in %08x out %08x",
                 impl->slots_idx, index, op_string[op], arg, before.val, status.val);
    if (impl->logs)
        buf_slot_logs_write(impl->logs, index, op, before, status);
    if (error)
        dump_slots(impl);
}